

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O0

void log_summary(bool ondemand)

{
  int iVar1;
  size_t sVar2;
  pid_t pVar3;
  bool bVar4;
  bool bVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  mapped_type *__dest;
  pointer ppVar9;
  pointer phVar10;
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  reverse_iterator it_2;
  _Self local_e0;
  _Self local_d8;
  iterator it_1;
  multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> allocations_by_size;
  _Self local_98;
  iterator callstack_it;
  undefined1 local_80 [8];
  vector<void_*,_std::allocator<void_*>_> callstack;
  _Self local_60;
  iterator it;
  map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
  allocations_by_callstack;
  unsigned_long_long leak_total_blocks;
  unsigned_long_long leak_total_bytes;
  FILE *f;
  bool ondemand_local;
  
  leak_total_bytes = 0;
  if (hu_log_file != (char *)0x0) {
    leak_total_bytes = (unsigned_long_long)fopen(hu_log_file,"a");
  }
  if (leak_total_bytes != 0) {
    leak_total_blocks = 0;
    allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
    ::map((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
           *)&it);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
         ::begin(allocations);
    while( true ) {
      callstack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                    ::end(allocations);
      bVar4 = std::operator!=(&local_60,
                              (_Self *)&callstack.
                                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage);
      if (!bVar4) break;
      std::vector<void_*,_std::allocator<void_*>_>::vector
                ((vector<void_*,_std::allocator<void_*>_> *)local_80);
      ppVar6 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                         (&local_60);
      ppVar7 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                         (&local_60);
      ppVar8 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                         (&local_60);
      std::vector<void*,std::allocator<void*>>::assign<void**,void>
                ((vector<void*,std::allocator<void*>> *)local_80,(ppVar6->second).callstack,
                 (ppVar7->second).callstack + (ppVar8->second).callstack_depth);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
           ::find((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                   *)&it,(key_type *)local_80);
      allocations_by_size._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                   ::end((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                          *)&it);
      bVar4 = std::operator!=(&local_98,
                              (_Self *)&allocations_by_size._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count);
      if (bVar4) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>
                 ::operator->(&local_98);
        (ppVar9->second).count = (ppVar9->second).count + 1;
        ppVar6 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                           (&local_60);
        sVar2 = (ppVar6->second).size;
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>
                 ::operator->(&local_98);
        (ppVar9->second).size = sVar2 + (ppVar9->second).size;
      }
      else {
        ppVar6 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                           (&local_60);
        __dest = std::
                 map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                 ::operator[]((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                               *)&it,(key_type *)local_80);
        memcpy(__dest,&ppVar6->second,0x160);
      }
      ppVar6 = std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator->
                         (&local_60);
      leak_total_blocks = (ppVar6->second).size + leak_total_blocks;
      allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_node_count =
           allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      std::vector<void_*,_std::allocator<void_*>_>::~vector
                ((vector<void_*,_std::allocator<void_*>_> *)local_80);
      std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>::operator++(&local_60);
    }
    std::multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_>::multiset
              ((multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> *)&it_1);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
         ::begin((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                  *)&it);
    while( true ) {
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
           ::end((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
                  *)&it);
      bVar4 = std::operator!=(&local_d8,&local_e0);
      if (!bVar4) break;
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>
               ::operator->(&local_d8);
      it_2.current._M_node =
           std::multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_>::insert
                     ((multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> *)
                      &it_1,&ppVar9->second);
      std::
      _Rb_tree_iterator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>
      ::operator++(&local_d8);
    }
    if (ondemand) {
      fprintf((FILE *)leak_total_bytes,"==%d== ON DEMAND REPORT\n",(ulong)(uint)pid);
    }
    fprintf((FILE *)leak_total_bytes,"==%d== HEAP SUMMARY:\n",(ulong)(uint)pid);
    fprintf((FILE *)leak_total_bytes,"==%d==     in use at exit: %llu bytes in %llu blocks\n",
            (ulong)(uint)pid,leak_total_blocks,
            allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_node_count);
    fprintf((FILE *)leak_total_bytes,
            "==%d==   total heap usage: %llu allocs, %llu frees, %llu bytes allocated\n",
            (ulong)(uint)pid,allocinfo_total_allocs,allocinfo_total_frees,
            allocinfo_total_alloc_bytes);
    fprintf((FILE *)leak_total_bytes,"==%d==    peak heap usage: %llu bytes allocated\n",
            (ulong)(uint)pid,allocinfo_peak_alloc_bytes);
    fprintf((FILE *)leak_total_bytes,"==%d== \n",(ulong)(uint)pid);
    if ((hu_leak & 1U) != 0) {
      std::multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_>::rbegin
                ((multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> *)local_f0
                );
      while( true ) {
        std::multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_>::rend
                  ((multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> *)
                   local_f8);
        bVar5 = std::operator!=((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                                local_f0,(reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>
                                          *)local_f8);
        bVar4 = false;
        if (bVar5) {
          phVar10 = std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator->
                              ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                               local_f0);
          bVar4 = hu_log_minleak <= phVar10->size;
        }
        if (!bVar4) break;
        phVar10 = std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator->
                            ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                             local_f0);
        iVar1 = phVar10->callstack_depth;
        phVar10 = std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator->
                            ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                             local_f0);
        bVar4 = log_is_valid_callstack(iVar1,phVar10->callstack,true);
        pVar3 = pid;
        if (bVar4) {
          phVar10 = std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator->
                              ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                               local_f0);
          sVar2 = phVar10->size;
          phVar10 = std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator->
                              ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                               local_f0);
          fprintf((FILE *)leak_total_bytes,
                  "==%d== %zu bytes in %d block(s) are lost, originally allocated at:\n",
                  (ulong)(uint)pVar3,sVar2,(ulong)(uint)phVar10->count);
          phVar10 = std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator->
                              ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                               local_f0);
          iVar1 = phVar10->callstack_depth;
          phVar10 = std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator->
                              ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)
                               local_f0);
          log_print_callstack((FILE *)leak_total_bytes,iVar1,phVar10->callstack);
          fprintf((FILE *)leak_total_bytes,"==%d== \n",(ulong)(uint)pid);
        }
        std::reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_>::operator++
                  ((reverse_iterator<std::_Rb_tree_const_iterator<hu_allocinfo_s>_> *)local_f0);
      }
    }
    fprintf((FILE *)leak_total_bytes,"==%d== LEAK SUMMARY:\n",(ulong)(uint)pid);
    fprintf((FILE *)leak_total_bytes,"==%d==    definitely lost: %llu bytes in %llu blocks\n",
            (ulong)(uint)pid,leak_total_blocks,
            allocations_by_callstack._M_t._M_impl.super__Rb_tree_header._M_node_count);
    fprintf((FILE *)leak_total_bytes,"==%d== \n",(ulong)(uint)pid);
    fclose((FILE *)leak_total_bytes);
    std::multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_>::~multiset
              ((multiset<hu_allocinfo_s,_size_compare,_std::allocator<hu_allocinfo_s>_> *)&it_1);
    std::
    map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
    ::~map((map<std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s,_std::less<std::vector<void_*,_std::allocator<void_*>_>_>,_std::allocator<std::pair<const_std::vector<void_*,_std::allocator<void_*>_>,_hu_allocinfo_s>_>_>
            *)&it);
  }
  return;
}

Assistant:

void log_summary(bool ondemand)
{
  FILE *f = NULL;
  if (hu_log_file)
  {
    f = fopen(hu_log_file, "a");
  }

  if (!f)
  {
    return;
  }

  unsigned long long leak_total_bytes = 0;
  unsigned long long leak_total_blocks = 0;

  /* Group results by callstack */
  std::map<std::vector<void*>, hu_allocinfo_t> allocations_by_callstack;
  for (auto it = allocations->begin(); it != allocations->end(); ++it)
  {
    std::vector<void*> callstack;
    callstack.assign(it->second.callstack, it->second.callstack + it->second.callstack_depth);

    auto callstack_it = allocations_by_callstack.find(callstack);
    if (callstack_it != allocations_by_callstack.end())
    {
      callstack_it->second.count += 1;
      callstack_it->second.size += it->second.size;
    }
    else
    {
      allocations_by_callstack[callstack] = it->second;
    }

    leak_total_bytes += it->second.size;
    leak_total_blocks += 1;
  }

  /* Sort results by total allocation size */
  std::multiset<hu_allocinfo_t, size_compare> allocations_by_size;
  for (auto it = allocations_by_callstack.begin(); it != allocations_by_callstack.end(); ++it)
  {
      allocations_by_size.insert(it->second);
  }

  /* Indicate in case an on-demand report */
  if (ondemand)
  {
    fprintf(f, "==%d== ON DEMAND REPORT\n", pid);
  }

  /* Output heap summary */
  fprintf(f, "==%d== HEAP SUMMARY:\n", pid);
  fprintf(f, "==%d==     in use at exit: %llu bytes in %llu blocks\n",
          pid, leak_total_bytes, leak_total_blocks);
  fprintf(f, "==%d==   total heap usage: %llu allocs, %llu frees, %llu bytes allocated\n",
          pid, allocinfo_total_allocs, allocinfo_total_frees, allocinfo_total_alloc_bytes);
  fprintf(f, "==%d==    peak heap usage: %llu bytes allocated\n",
          pid, allocinfo_peak_alloc_bytes);
  fprintf(f, "==%d== \n", pid);

  /* Output leak details */
  if (hu_leak)
  {
    for (auto it = allocations_by_size.rbegin(); (it != allocations_by_size.rend()) && (it->size >= hu_log_minleak); ++it)
    {
      if (log_is_valid_callstack(it->callstack_depth, it->callstack, true))
      {
        fprintf(f, "==%d== %zu bytes in %d block(s) are lost, originally allocated at:\n", pid, it->size, it->count);

        log_print_callstack(f, it->callstack_depth, it->callstack);
    
        fprintf(f, "==%d== \n", pid);
      }
    }
  }
  
  /* Output leak summary */
  fprintf(f, "==%d== LEAK SUMMARY:\n", pid);
  fprintf(f, "==%d==    definitely lost: %llu bytes in %llu blocks\n", pid,
         leak_total_bytes, leak_total_blocks);
  fprintf(f, "==%d== \n", pid);

  fclose(f);
}